

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O3

If_LibLut_t * If_LibLutReadString(char *pStr)

{
  char *pcVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  uint *__ptr;
  void *pvVar5;
  size_t sVar6;
  char *__dest;
  If_LibLut_t *__ptr_00;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  float (*pafVar12) [33];
  double dVar13;
  
  if ((pStr == (char *)0x0) || (uVar7 = 0, *pStr == '\0')) {
    __ptr_00 = (If_LibLut_t *)0x0;
  }
  else {
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 1000;
    __ptr[1] = 0;
    pvVar5 = malloc(8000);
    *(void **)(__ptr + 2) = pvVar5;
    sVar6 = strlen(pStr);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,pStr);
    pcVar8 = __dest;
    if (*__dest != '\0') {
      do {
        uVar7 = __ptr[1];
        if (uVar7 == *__ptr) {
          if ((int)uVar7 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(0x80);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = 0x10;
          }
          else {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc((ulong)uVar7 << 4);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar7 << 4);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar7 * 2;
          }
        }
        else {
          pvVar5 = *(void **)(__ptr + 2);
        }
        __ptr[1] = uVar7 + 1;
        *(char **)((long)pvVar5 + (long)(int)uVar7 * 8) = pcVar8;
        pcVar8 = pcVar8 + -1;
        do {
          pcVar1 = pcVar8 + 1;
          pcVar8 = pcVar8 + 1;
        } while (*pcVar1 != '\n');
        do {
          *pcVar8 = '\0';
          pcVar1 = pcVar8 + 1;
          pcVar8 = pcVar8 + 1;
        } while (*pcVar1 == '\n');
      } while (*pcVar1 != '\0');
      uVar7 = __ptr[1];
    }
    __ptr_00 = (If_LibLut_t *)calloc(1,0x1198);
    if ((int)uVar7 < 1) {
      __ptr_00->LutMax = 0;
    }
    else {
      pvVar5 = *(void **)(__ptr + 2);
      uVar9 = 1;
      bVar3 = false;
      uVar11 = 0;
      do {
        pcVar8 = *(char **)((long)pvVar5 + uVar11 * 8);
        if (((*pcVar8 != '\0') && (pcVar8 = strtok(pcVar8," \t\n"), pcVar8 != (char *)0x0)) &&
           (*pcVar8 != '#')) {
          uVar4 = atoi(pcVar8);
          if (uVar9 != uVar4) {
            Abc_Print(1,"Error in the LUT library string.\n");
            free(__ptr_00);
            free(__dest);
            __ptr_00 = (If_LibLut_t *)0x0;
            goto LAB_004311c5;
          }
          pcVar8 = strtok((char *)0x0," \t\n");
          dVar13 = atof(pcVar8);
          __ptr_00->pLutAreas[(int)uVar9] = (float)dVar13;
          pcVar8 = strtok((char *)0x0," \t\n");
          if (pcVar8 == (char *)0x0) {
            if (-1 < (int)uVar9) goto LAB_004310c1;
            uVar10 = 0;
LAB_004312b3:
            Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",(ulong)uVar9,
                      uVar10 & 0xffffffff,(ulong)uVar9);
            free(__ptr_00);
            free(__dest);
          }
          else {
            uVar10 = 0;
            do {
              dVar13 = atof(pcVar8);
              __ptr_00->pLutDelays[(int)uVar9][uVar10] = (float)dVar13;
              uVar10 = uVar10 + 1;
              pcVar8 = strtok((char *)0x0," \t\n");
            } while (pcVar8 != (char *)0x0);
            if ((int)uVar9 < (int)uVar10) goto LAB_004312b3;
            if (uVar10 != 1) {
              __ptr_00->fVarPinDelays = 1;
              bVar3 = true;
            }
LAB_004310c1:
            if (uVar9 != 0x20) {
              uVar9 = uVar9 + 1;
              goto LAB_004310ce;
            }
            Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
            free(__ptr_00);
            free(__dest);
          }
          __ptr_00 = (If_LibLut_t *)0x0;
          if (pvVar5 == (void *)0x0) goto LAB_004311ca;
          goto LAB_004311c5;
        }
LAB_004310ce:
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar7);
      __ptr_00->LutMax = uVar9 - 1;
      if (bVar3) {
        if (1 < (int)uVar9) {
          pafVar12 = __ptr_00->pLutDelays;
          uVar11 = 1;
          do {
            pafVar12 = pafVar12 + 1;
            uVar10 = 0;
            do {
              fVar2 = (*pafVar12)[uVar10];
              if (fVar2 <= 0.0) {
                Abc_Print(0,
                          "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                          ,(double)fVar2,uVar10 & 0xffffffff,uVar11 & 0xffffffff);
              }
              if ((uVar10 != 0) && (fVar2 < pafVar12[-1][uVar10 + 0x20])) {
                Abc_Print(0,
                          "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                          ,(double)pafVar12[-1][uVar10 + 0x20],(double)fVar2,
                          (ulong)((int)uVar10 - 1),uVar11 & 0xffffffff,uVar10 & 0xffffffff,
                          uVar11 & 0xffffffff);
              }
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar9);
        }
      }
      else if (1 < (int)uVar9) {
        pafVar12 = __ptr_00->pLutDelays;
        uVar11 = 1;
        do {
          pafVar12 = pafVar12 + 1;
          if ((*pafVar12)[0] <= 0.0) {
            Abc_Print(0,
                      "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)(*pafVar12)[0],uVar11 & 0xffffffff);
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
    }
    free(__dest);
    pvVar5 = *(void **)(__ptr + 2);
    if (pvVar5 != (void *)0x0) {
LAB_004311c5:
      free(pvVar5);
    }
LAB_004311ca:
    free(__ptr);
  }
  return __ptr_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the description of LUTs from the LUT library file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_LibLut_t * If_LibLutReadString( char * pStr )
{
    If_LibLut_t * p;
    Vec_Ptr_t * vStrs;
    char * pToken, * pBuffer, * pStrNew, * pStrMem;
    int i, k, j;

    if ( pStr == NULL || pStr[0] == 0 )
        return NULL;

    vStrs = Vec_PtrAlloc( 1000 );
    pStrNew = pStrMem = Abc_UtilStrsav( pStr );
    while ( *pStrNew )
    {
        Vec_PtrPush( vStrs, pStrNew );
        while ( *pStrNew != '\n' )
            pStrNew++;
        while ( *pStrNew == '\n' )
            *pStrNew++ = '\0';
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );

    i = 1;
    //while ( fgets( pBuffer, 1000, pFile ) != NULL )
    Vec_PtrForEachEntry( char *, vStrs, pBuffer, j )
    {
        if ( pBuffer[0] == 0 )
            continue;
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library string.\n" );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    // cleanup
    ABC_FREE( pStrMem );
    Vec_PtrFree( vStrs );
    return p;
}